

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmModuleGenerator::GenerateFunctionHeader(WasmModuleGenerator *this,uint32 index)

{
  undefined1 *puVar1;
  uint uVar2;
  WasmSignature *pWVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  AsmJsVarType type;
  ArgSlot AVar7;
  ushort uVar8;
  Type TVar9;
  int iVar10;
  BOOL BVar11;
  Type displayNameLength;
  Local wasmType;
  WasmType wasmType_00;
  AsmJsRetType AVar12;
  WasmFunctionInfo *this_00;
  WasmExport *pWVar13;
  Recycler *pRVar14;
  undefined4 *puVar15;
  char16_t *displayName;
  FunctionBody *this_01;
  WasmReaderInfo *addr;
  AsmJsFunctionInfo *this_02;
  uint *puVar16;
  Which *pWVar17;
  WasmCompilationException *this_03;
  WebAssemblyModule *pWVar18;
  ArgSlot i;
  ulong uVar19;
  size_t size;
  ulong size_00;
  uint32 iExport;
  size_t sizeInWords;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  this_00 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
  if (this_00 == (WasmFunctionInfo *)0x0) {
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_03,L"Invalid function index %u",(ulong)index);
    goto LAB_00f1bc36;
  }
  displayNameLength = this_00->m_nameLength;
  if (displayNameLength == 0) {
    pWVar18 = this->m_module;
    if (pWVar18->m_exportCount != 0) {
      iExport = 0;
      do {
        pWVar13 = Js::WebAssemblyModule::GetExport(pWVar18,iExport);
        if ((((pWVar13 != (WasmExport *)0x0) && (pWVar13->kind == Function)) &&
            (pWVar13->nameLength != 0)) &&
           ((TVar9 = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,pWVar13->index),
            TVar9 == Function && (pWVar13->index == this_00->m_number)))) {
          iVar10 = pWVar13->nameLength + 0x10;
          sizeInWords = (size_t)iVar10;
          local_80 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_afd84ff;
          data.filename._0_4_ = 0x187;
          data.plusSize = sizeInWords;
          pRVar14 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_80);
          if (iVar10 == 0) {
            Memory::Recycler::ClearTrackAllocInfo(pRVar14,(TrackAllocData *)0x0);
            displayName = (char16_t *)&DAT_00000008;
          }
          else {
            size = 0xffffffffffffffff;
            if (-1 < iVar10) {
              size = sizeInWords * 2;
            }
            BVar11 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar11 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar15 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                 "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar6) goto LAB_00f1bbf3;
              *puVar15 = 0;
            }
            displayName = (char16_t *)
                          Memory::Recycler::
                          AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>(pRVar14,size);
            if (displayName == (char16_t *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar15 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar6) goto LAB_00f1bbf3;
              *puVar15 = 0;
              displayName = (char16_t *)0x0;
            }
          }
          displayNameLength =
               swprintf_s((char16_t_conflict *)displayName,sizeInWords,
                          (char16_t_conflict *)L"%s[%u]");
          goto LAB_00f1b445;
        }
        iExport = iExport + 1;
        pWVar18 = this->m_module;
      } while (iExport < pWVar18->m_exportCount);
    }
LAB_00f1b5ea:
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x20;
    data.count = (size_t)anon_var_dwarf_afd84ff;
    data.filename._0_4_ = 0x191;
    pRVar14 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_80);
    BVar11 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_00f1bbf3;
      *puVar15 = 0;
    }
    displayName = (char16_t *)
                  Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                            (pRVar14,0x40);
    if (displayName == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) goto LAB_00f1bbf3;
      *puVar15 = 0;
    }
    displayNameLength =
         swprintf_s((char16_t_conflict *)displayName,0x20,(char16_t_conflict *)L"wasm-function[%u]")
    ;
  }
  else {
    displayName = (this_00->m_name).ptr;
LAB_00f1b445:
    if (displayName == (char16_t *)0x0) goto LAB_00f1b5ea;
  }
  this_01 = Js::FunctionBody::NewFromRecycler
                      (this->m_scriptContext,displayName,displayNameLength,0,0,this->m_sourceInfo,
                       ((((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                       sourceContextId,this_00->m_number,ErrorOnNew,Flags_None);
  Memory::Recycler::WBSetBit((char *)&this_00->m_body);
  (this_00->m_body).ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->m_body);
  Js::ParseableFunctionInfo::SetSourceInfo(&this_01->super_ParseableFunctionInfo,0);
  Js::FunctionBody::AllocateAsmJsFunctionInfo(this_01);
  puVar1 = &(this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar1 = *puVar1 | 0x40;
  puVar1 = &(this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 0xe;
  local_80 = (undefined1  [8])&WasmReaderInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_afd84ff;
  data.filename._0_4_ = 0x1ad;
  pRVar14 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_80);
  addr = (WasmReaderInfo *)new<Memory::Recycler>(0x10,pRVar14,0x387914);
  (addr->m_funcInfo).ptr = (WasmFunctionInfo *)0x0;
  (addr->m_module).ptr = (WebAssemblyModule *)0x0;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->m_funcInfo).ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pWVar18 = this->m_module;
  Memory::Recycler::WBSetBit((char *)&addr->m_module);
  (addr->m_module).ptr = pWVar18;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&addr->m_module);
  Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(this_01);
  this_02 = (AsmJsFunctionInfo *)
            Js::FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,AsmJsFunctionInfo);
  Memory::Recycler::WBSetBit((char *)&this_02->mWasmReaderInfo);
  (this_02->mWasmReaderInfo).ptr = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_02->mWasmReaderInfo);
  pWVar18 = this->m_module;
  Memory::Recycler::WBSetBit((char *)&this_02->mWasmModule);
  (this_02->mWasmModule).ptr = pWVar18;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_02->mWasmModule);
  AVar7 = WasmFunctionInfo::GetParamCount(this_00);
  this_02->mArgCount = AVar7;
  pWVar3 = (this_00->m_signature).ptr;
  Memory::Recycler::WBSetBit((char *)&this_02->mSignature);
  (this_02->mSignature).ptr = pWVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_02->mSignature);
  uVar8 = 3;
  if (3 < AVar7) {
    uVar8 = AVar7;
  }
  this_02->mArgSizesLength = uVar8;
  data.plusSize = (size_t)uVar8;
  local_80 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_afd84ff;
  data.filename._0_4_ = 0x1bc;
  pRVar14 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_80);
  BVar11 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar6) goto LAB_00f1bbf3;
    *puVar15 = 0;
  }
  puVar16 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                              (pRVar14,(ulong)uVar8 << 2);
  if (puVar16 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar6) goto LAB_00f1bbf3;
    *puVar15 = 0;
  }
  Memory::Recycler::WBSetBit((char *)&this_02->mArgSizes);
  (this_02->mArgSizes).ptr = puVar16;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_02->mArgSizes);
  if (AVar7 == 0) {
    puVar1 = &(this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    *puVar1 = *puVar1 & 0xfb;
  }
  else {
    data._32_8_ = puVar16;
    Js::ParseableFunctionInfo::SetInParamsCount(&this_01->super_ParseableFunctionInfo,AVar7 + 1);
    Js::ParseableFunctionInfo::SetReportedInParamsCount
              (&this_01->super_ParseableFunctionInfo,AVar7 + 1);
    size_00 = (ulong)AVar7;
    local_80 = (undefined1  [8])&Js::AsmJsVarType::Which::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_afd84ff;
    data.filename._0_4_ = 0x1c4;
    data.plusSize = size_00;
    pRVar14 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_80);
    BVar11 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_00f1bbf3;
      *puVar15 = 0;
    }
    pWVar17 = (Which *)Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(pRVar14,size_00)
    ;
    if (pWVar17 == (Which *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) {
LAB_00f1bbf3:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar15 = 0;
    }
    Memory::Recycler::WBSetBit((char *)&this_02->mArgType);
    (this_02->mArgType).ptr = pWVar17;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_02->mArgType);
    uVar5 = data._32_8_;
    uVar19 = 0;
    do {
      AVar7 = (ArgSlot)uVar19;
      wasmType = WasmSignature::GetParam((this_00->m_signature).ptr,AVar7);
      type = WasmToAsmJs::GetAsmJsVarType(wasmType);
      Js::AsmJsFunctionInfo::SetArgType(this_02,type,AVar7);
      AVar7 = WasmSignature::GetParamSize((this_00->m_signature).ptr,AVar7);
      *(uint *)(uVar5 + uVar19 * 4) = (uint)AVar7;
      uVar19 = uVar19 + 1;
    } while (size_00 != uVar19);
  }
  AVar7 = WasmSignature::GetParamsSize((this_00->m_signature).ptr);
  this_02->mArgByteSize = AVar7;
  pWVar3 = (this_00->m_signature).ptr;
  uVar2 = pWVar3->m_resultsCount;
  if (uVar2 < 2) {
    wasmType_00 = Void;
    if (uVar2 == 1) {
      wasmType_00 = WasmSignature::GetResult(pWVar3,0);
    }
    AVar12 = WasmToAsmJs::GetAsmJsReturnType(wasmType_00);
    (this_02->mReturnType).which_ = AVar12.which_;
    return;
  }
  this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_03,L"Multi return values not supported");
LAB_00f1bc36:
  __cxa_throw(this_03,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmModuleGenerator::GenerateFunctionHeader(uint32 index)
{
    WasmFunctionInfo* wasmInfo = m_module->GetWasmFunctionInfo(index);
    if (!wasmInfo)
    {
        throw WasmCompilationException(_u("Invalid function index %u"), index);
    }

    const char16* functionName = nullptr;
    int nameLength = 0;

    if (wasmInfo->GetNameLength() > 0)
    {
        functionName = wasmInfo->GetName();
        nameLength = wasmInfo->GetNameLength();
    }
    else
    {
        for (uint32 iExport = 0; iExport < m_module->GetExportCount(); ++iExport)
        {
            Wasm::WasmExport* wasmExport = m_module->GetExport(iExport);
            if (wasmExport  &&
                wasmExport->kind == ExternalKinds::Function &&
                wasmExport->nameLength > 0 &&
                m_module->GetFunctionIndexType(wasmExport->index) == FunctionIndexTypes::Function &&
                wasmExport->index == wasmInfo->GetNumber())
            {
                nameLength = wasmExport->nameLength + 16;
                char16 * autoName = RecyclerNewArrayLeafZ(m_recycler, char16, nameLength);
                nameLength = swprintf_s(autoName, nameLength, _u("%s[%u]"), wasmExport->name, wasmInfo->GetNumber());
                functionName = autoName;
                break;
            }
        }
    }

    if (!functionName)
    {
        char16* autoName = RecyclerNewArrayLeafZ(m_recycler, char16, 32);
        nameLength = swprintf_s(autoName, 32, _u("wasm-function[%u]"), wasmInfo->GetNumber());
        functionName = autoName;
    }

    Js::FunctionBody* body = Js::FunctionBody::NewFromRecycler(
        m_scriptContext,
        functionName,
        nameLength,
        0,
        0,
        m_sourceInfo,
        m_sourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
        wasmInfo->GetNumber(),
        Js::FunctionInfo::Attributes::ErrorOnNew,
        Js::FunctionBody::Flags_None
#ifdef PERF_COUNTERS
        , false /* is function from deferred deserialized proxy */
#endif
    );
    wasmInfo->SetBody(body);
    // TODO (michhol): numbering
    body->SetSourceInfo(0);
    body->AllocateAsmJsFunctionInfo();
    body->SetIsAsmJsFunction(true);
    body->SetIsAsmjsMode(true);
    body->SetIsWasmFunction(true);

    WasmReaderInfo* readerInfo = RecyclerNew(m_recycler, WasmReaderInfo);
    readerInfo->m_funcInfo = wasmInfo;
    readerInfo->m_module = m_module;

    Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(body);

    Js::AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
    info->SetWasmReaderInfo(readerInfo);
    info->SetWebAssemblyModule(m_module);

    Js::ArgSlot paramCount = wasmInfo->GetParamCount();
    info->SetArgCount(paramCount);
    info->SetWasmSignature(wasmInfo->GetSignature());
    Js::ArgSlot argSizeLength = max(paramCount, 3ui16);
    info->SetArgSizeArrayLength(argSizeLength);
    uint32* argSizeArray = RecyclerNewArrayLeafZ(m_recycler, uint32, argSizeLength);
    info->SetArgsSizesArray(argSizeArray);

    if (paramCount > 0)
    {
        // +1 here because asm.js includes the this pointer
        body->SetInParamsCount(paramCount + 1);
        body->SetReportedInParamsCount(paramCount + 1);
        info->SetArgTypeArray(RecyclerNewArrayLeaf(m_recycler, Js::AsmJsVarType::Which, paramCount));
    }
    else
    {
        // overwrite default value in this case
        body->SetHasImplicitArgIns(false);
    }
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        WasmTypes::WasmType type = wasmInfo->GetSignature()->GetParam(i);
        info->SetArgType(WasmToAsmJs::GetAsmJsVarType(type), i);
        argSizeArray[i] = wasmInfo->GetSignature()->GetParamSize(i);
    }
    info->SetArgByteSize(wasmInfo->GetSignature()->GetParamsSize());
    if (wasmInfo->GetSignature()->GetResultCount() <= 1)
    {
        WasmTypes::WasmType returnType = wasmInfo->GetSignature()->GetResultCount() == 1 ? wasmInfo->GetSignature()->GetResult(0) : WasmTypes::Void;
        info->SetReturnType(WasmToAsmJs::GetAsmJsReturnType(returnType));
    }
    else
    {
        throw WasmCompilationException(_u("Multi return values not supported"));
    }
}